

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundStatement.cpp
# Opt level: O3

void __thiscall hdc::CompoundStatement::~CompoundStatement(CompoundStatement *this)

{
  Statement *pSVar1;
  pointer ppSVar2;
  pointer ppSVar3;
  ulong uVar4;
  
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR_accept_00197f78;
  ppSVar3 = (this->statements).
            super__Vector_base<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppSVar2 = (this->statements).
            super__Vector_base<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppSVar2 != ppSVar3) {
    uVar4 = 0;
    do {
      pSVar1 = ppSVar3[uVar4];
      if (pSVar1 != (Statement *)0x0) {
        (*(pSVar1->super_ASTNode)._vptr_ASTNode[2])(pSVar1);
        ppSVar3 = (this->statements).
                  super__Vector_base<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>._M_impl.
                  super__Vector_impl_data._M_start;
        ppSVar2 = (this->statements).
                  super__Vector_base<hdc::Statement_*,_std::allocator<hdc::Statement_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (ulong)((long)ppSVar2 - (long)ppSVar3 >> 3));
  }
  if (ppSVar3 != (pointer)0x0) {
    operator_delete(ppSVar3);
  }
  Statement::~Statement(&this->super_Statement);
  return;
}

Assistant:

CompoundStatement::~CompoundStatement() {
    for (int i = 0; i < statements.size(); ++i) {
        delete statements[i];
    }
}